

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayImageOpCompute::configureProgram(TextureCubeMapArrayImageOpCompute *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  pointer_____offset_0x10___ *ppuVar6;
  char *csCode;
  char *tcsCode;
  char *tesCode;
  char *fsCode;
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  switch(this->m_shader_to_check) {
  case STC_COMPUTE_SHADER:
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x91b9);
    this->m_cs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x308);
    csCode = 
    "${VERSION}\n\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (rgba32f,  binding = 0) highp uniform readonly imageCubeArray  imageRead;\nlayout (rgba32i,  binding = 1) highp uniform readonly iimageCubeArray iimageRead;\nlayout (rgba32ui, binding = 2) highp uniform readonly uimageCubeArray uimageRead;\nlayout (rgba32f,  binding = 3) highp uniform writeonly imageCubeArray  imageWrite;\nlayout (rgba32i,  binding = 4) highp uniform writeonly iimageCubeArray iimageWrite;\nlayout (rgba32ui, binding = 5) highp uniform writeonly uimageCubeArray uimageWrite;\n\nvoid main(void)\n{\n    ivec3 position = ivec3(gl_GlobalInvocationID.xyz);\n    imageStore(imageWrite,  position, imageLoad(imageRead,  position));\n    imageStore(iimageWrite, position, imageLoad(iimageRead, position));\n    imageStore(uimageWrite, position, imageLoad(uimageRead, position));\n}\n"
    ;
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_cs_id,1,&csCode,(bool *)0x0);
    if (bVar1) {
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)this_00,"Could not create a program from valid compute shader code!",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x30f);
    ppuVar6 = &tcu::TestError::typeinfo;
    goto LAB_00d66571;
  case STC_FRAGMENT_SHADER:
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x329);
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x32b);
    csCode = 
    "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n    gl_Position = vec4(0, 0, 0, 1.0f);\n    gl_PointSize = 1.0f;\n}\n"
    ;
    tcsCode = 
    "${VERSION}\n\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nlayout (rgba32f,  binding = 0) highp uniform readonly imageCubeArray  imageRead;\nlayout (rgba32i,  binding = 1) highp uniform readonly iimageCubeArray iimageRead;\nlayout (rgba32ui, binding = 2) highp uniform readonly uimageCubeArray uimageRead;\nlayout (rgba32f,  binding = 3) highp uniform writeonly imageCubeArray  imageWrite;\nlayout (rgba32i,  binding = 4) highp uniform writeonly iimageCubeArray iimageWrite;\nlayout (rgba32ui, binding = 5) highp uniform writeonly uimageCubeArray uimageWrite;\n\nuniform ivec3 dimensions;\n\nvoid main()\n{\n\n    for(int w = 0; w < dimensions[0]; ++w)\n    {\n        for(int h = 0; h < dimensions[1]; ++h)\n        {\n            for(int d = 0; d < dimensions[2]; ++d)\n            {\n                ivec3  position  = ivec3(w,h,d);\n                imageStore(imageWrite,  position, imageLoad(imageRead,  position));\n                imageStore(iimageWrite, position, imageLoad(iimageRead, position));\n                imageStore(uimageWrite, position, imageLoad(uimageRead, position));\n            }        }    }\n}\n"
    ;
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&tcsCode,
                       this->m_vs_id,1,&csCode,(bool *)0x0);
    if (bVar1) {
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,
               "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Fragment Shader"
               ,fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x335);
    break;
  case STC_GEOMETRY_SHADER:
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x33c);
    GVar3 = (**(code **)(lVar5 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_gs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x33e);
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x340);
    csCode = 
    "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n    gl_Position = vec4(0, 0, 0, 1.0f);\n    gl_PointSize = 1.0f;\n}\n"
    ;
    tcsCode = 
    "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nlayout (rgba32f,  binding = 0) highp uniform readonly imageCubeArray  imageRead;\nlayout (rgba32i,  binding = 1) highp uniform readonly iimageCubeArray iimageRead;\nlayout (rgba32ui, binding = 2) highp uniform readonly uimageCubeArray uimageRead;\nlayout (rgba32f,  binding = 3) highp uniform writeonly imageCubeArray  imageWrite;\nlayout (rgba32i,  binding = 4) highp uniform writeonly iimageCubeArray iimageWrite;\nlayout (rgba32ui, binding = 5) highp uniform writeonly uimageCubeArray uimageWrite;\n\nuniform ivec3 dimensions;\n\nlayout(points) in;\nlayout(points, max_vertices=1) out;\n\nvoid main()\n{\n\n    for(int w = 0; w < dimensions[0]; ++w)\n    {\n        for(int h = 0; h < dimensions[1]; ++h)\n        {\n            for(int d = 0; d < dimensions[2]; ++d)\n            {\n                ivec3  position  = ivec3(w,h,d);\n                imageStore(imageWrite,  position, imageLoad(imageRead,  position));\n                imageStore(iimageWrite, position, imageLoad(iimageRead, position));\n                imageStore(uimageWrite, position, imageLoad(uimageRead, position));\n            }\n        }\n    }\n\n}\n"
    ;
    tesCode = "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n}\n";
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&tesCode,
                       this->m_gs_id,1,&tcsCode,this->m_vs_id,1,&csCode,(bool *)0x0);
    if (bVar1) {
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,
               "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Geometry Shader"
               ,fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x34c);
    break;
  case STC_TESSELLATION_CONTROL_SHADER:
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x353);
    GVar3 = (**(code **)(lVar5 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    this->m_tc_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x355);
    GVar3 = (**(code **)(lVar5 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    this->m_te_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x357);
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x359);
    csCode = 
    "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n    gl_Position = vec4(0, 0, 0, 1.0f);\n    gl_PointSize = 1.0f;\n}\n"
    ;
    tcsCode = 
    "${VERSION}\n\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n${TESSELLATION_SHADER_ENABLE}\n\nprecision highp float;\n\nlayout (rgba32f,  binding = 0) highp uniform readonly imageCubeArray  imageRead;\nlayout (rgba32i,  binding = 1) highp uniform readonly iimageCubeArray iimageRead;\nlayout (rgba32ui, binding = 2) highp uniform readonly uimageCubeArray uimageRead;\nlayout (rgba32f,  binding = 3) highp uniform writeonly imageCubeArray  imageWrite;\nlayout (rgba32i,  binding = 4) highp uniform writeonly iimageCubeArray iimageWrite;\nlayout (rgba32ui, binding = 5) highp uniform writeonly uimageCubeArray uimageWrite;\n\nuniform ivec3 dimensions;\n\nlayout (vertices = 1) out;\n\nvoid main()\n{\n\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n\n    for(int w = 0; w < dimensions[0]; ++w)\n    {\n        for(int h = 0; h < dimensions[1]; ++h)\n        {\n            for(int d = 0; d < dimensions[2]; ++d)\n            {\n                ivec3  position  = ivec3(w,h,d);\n                imageStore(imageWrite,  position, imageLoad(imageRead,  position.xyz));\n                imageStore(iimageWrite, position, imageLoad(iimageRead, position.xyz));\n                imageStore(uimageWrite, position, imageLoad(uimageRead, position.xyz));\n            }\n        }\n    }\n\n}\n"
    ;
    tesCode = 
    "${VERSION}\n\n${TESSELLATION_SHADER_ENABLE}\n\nprecision highp float;\n\nlayout(isolines, point_mode) in;\nvoid main()\n{\n}\n"
    ;
    fsCode = "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n}\n";
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&fsCode,this->m_tc_id
                       ,1,&tcsCode,this->m_te_id,1,&tesCode,this->m_vs_id,1,&csCode,(bool *)0x0);
    if (bVar1) {
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,
               "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Tessellation Control Shader"
               ,fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x366);
    break;
  case STC_TESSELLATION_EVALUATION_SHADER:
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x36d);
    GVar3 = (**(code **)(lVar5 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    this->m_tc_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x36f);
    GVar3 = (**(code **)(lVar5 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    this->m_te_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x371);
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x373);
    csCode = 
    "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n    gl_Position = vec4(0, 0, 0, 1.0f);\n    gl_PointSize = 1.0f;\n}\n"
    ;
    tcsCode = 
    "${VERSION}\n\n${TESSELLATION_SHADER_ENABLE}\n\nprecision highp float;\n\nlayout (vertices = 1) out;\n\nvoid main()\n{\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n}\n"
    ;
    tesCode = 
    "${VERSION}\n\n${TESSELLATION_SHADER_ENABLE}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nlayout (rgba32f,  binding = 0) highp uniform readonly imageCubeArray  imageRead;\nlayout (rgba32i,  binding = 1) highp uniform readonly iimageCubeArray iimageRead;\nlayout (rgba32ui, binding = 2) highp uniform readonly uimageCubeArray uimageRead;\nlayout (rgba32f,  binding = 3) highp uniform writeonly imageCubeArray  imageWrite;\nlayout (rgba32i,  binding = 4) highp uniform writeonly iimageCubeArray iimageWrite;\nlayout (rgba32ui, binding = 5) highp uniform writeonly uimageCubeArray uimageWrite;\n\nuniform ivec3 dimensions;\n\nlayout(isolines, point_mode) in;\nvoid main()\n{\n\n    for(int w = 0; w < dimensions[0]; ++w)\n    {\n        for(int h = 0; h < dimensions[1]; ++h)\n        {\n            for(int d = 0; d < dimensions[2]; ++d)\n            {\n                ivec3  position  = ivec3(w,h,d);\n                imageStore(imageWrite,  position, imageLoad(imageRead,  position));\n                imageStore(iimageWrite, position, imageLoad(iimageRead, position));\n                imageStore(uimageWrite, position, imageLoad(uimageRead, position));\n            }\n        }\n    }\n\n}\n"
    ;
    fsCode = "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n}\n";
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&fsCode,this->m_tc_id
                       ,1,&tcsCode,this->m_te_id,1,&tesCode,this->m_vs_id,1,&csCode,(bool *)0x0);
    if (bVar1) {
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,
               "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Tessellation Evaluation Shader"
               ,fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x380);
    break;
  case STC_VERTEX_SHADER:
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x316);
    GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x318);
    csCode = 
    "${VERSION}\n\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nlayout (rgba32f,  binding = 0) highp uniform readonly imageCubeArray  imageRead;\nlayout (rgba32i,  binding = 1) highp uniform readonly iimageCubeArray iimageRead;\nlayout (rgba32ui, binding = 2) highp uniform readonly uimageCubeArray uimageRead;\nlayout (rgba32f,  binding = 3) highp uniform writeonly imageCubeArray  imageWrite;\nlayout (rgba32i,  binding = 4) highp uniform writeonly iimageCubeArray iimageWrite;\nlayout (rgba32ui, binding = 5) highp uniform writeonly uimageCubeArray uimageWrite;\n\nuniform ivec3 dimensions;\n\nvoid main()\n{\n\n    gl_PointSize = 1.0f;\n    for(int w = 0; w < dimensions[0]; ++w)\n    {\n        for(int h = 0; h < dimensions[1]; ++h)\n        {\n            for(int d = 0; d < dimensions[2]; ++d)\n            {\n                ivec3  position  = ivec3(w,h,d);\n                imageStore(imageWrite,  position, imageLoad(imageRead,  position));\n                imageStore(iimageWrite, position, imageLoad(iimageRead, position));\n                imageStore(uimageWrite, position, imageLoad(uimageRead, position));\n            }\n        }\n    }\n\n}\n"
    ;
    tcsCode = "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n}\n";
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&tcsCode,
                       this->m_vs_id,1,&csCode,(bool *)0x0);
    if (bVar1) {
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,
               "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Vertex Shader",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
               ,0x322);
    break;
  default:
    return;
  }
  ppuVar6 = &tcu::NotSupportedError::typeinfo;
LAB_00d66571:
  __cxa_throw(this_00,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayImageOpCompute::configureProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	switch (m_shader_to_check)
	{
	case STC_COMPUTE_SHADER:
	{
		m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* csCode = getComputeShaderCode();

		/* Images are required for compute shader */
		if (!buildProgram(m_po_id, m_cs_id, 1 /* part */, &csCode))
		{
			TCU_FAIL("Could not create a program from valid compute shader code!");
		}
		break;
	}
	case STC_VERTEX_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode = getVertexShaderCode();
		const char* fsCode = getFragmentShaderCodeBoilerPlate();

		/* Execute test only if images are supported by vertex shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_vs_id, 1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Vertex Shader", "", __FILE__,
				__LINE__);
		}
		break;
	}
	case STC_FRAGMENT_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode = getVertexShaderCodeBoilerPlate();
		const char* fsCode = getFragmentShaderCode();

		/* Execute test only if images are supported by fragment shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_vs_id, 1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Fragment Shader", "", __FILE__,
				__LINE__);
		}
		break;
	}
	case STC_GEOMETRY_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode = getVertexShaderCodeBoilerPlate();
		const char* gsCode = getGeometryShaderCode();
		const char* fsCode = getFragmentShaderCodeBoilerPlate();

		/* Execute test only if images are supported by geometry shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_gs_id, 1 /* part */, &gsCode, m_vs_id,
						  1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Geometry Shader", "", __FILE__,
				__LINE__);
		}
		break;
	}
	case STC_TESSELLATION_CONTROL_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode  = getVertexShaderCodeBoilerPlate();
		const char* tcsCode = getTessControlShaderCode();
		const char* tesCode = getTessEvaluationShaderCodeBoilerPlate();
		const char* fsCode  = getFragmentShaderCodeBoilerPlate();

		/* Execute test only if images are supported by tessellation control shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_tc_id, 1 /* part */, &tcsCode, m_te_id,
						  1 /* part */, &tesCode, m_vs_id, 1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Tessellation Control Shader", "",
				__FILE__, __LINE__);
		}
		break;
	}
	case STC_TESSELLATION_EVALUATION_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode  = getVertexShaderCodeBoilerPlate();
		const char* tcsCode = getTessControlShaderCodeBoilerPlate();
		const char* tesCode = getTessEvaluationShaderCode();
		const char* fsCode  = getFragmentShaderCodeBoilerPlate();

		/* Execute test only if images are supported by tessellation evaluation shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_tc_id, 1 /* part */, &tcsCode, m_te_id,
						  1 /* part */, &tesCode, m_vs_id, 1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Tessellation Evaluation Shader",
				"", __FILE__, __LINE__);
		}
		break;
	}
	default:
		break;
	}
}